

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LedgerFormats.cpp
# Opt level: O1

void __thiscall jbcoin::LedgerFormats::LedgerFormats(LedgerFormats *this)

{
  _Rb_tree_header *p_Var1;
  Item *pIVar2;
  SOElement local_120;
  SOElement local_110;
  SOElement local_100;
  SOElement local_f0;
  SOElement local_e0;
  SOElement local_d0;
  SOElement local_c0;
  SOElement local_b0;
  SOElement local_a0;
  SOElement local_90;
  SOElement local_80;
  SOElement local_70;
  SOElement local_60;
  SOElement local_50;
  SOElement local_40;
  
  (this->super_KnownFormats<jbcoin::LedgerEntryType>).m_formats.
  super__Vector_base<std::unique_ptr<jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item>_>,_std::allocator<std::unique_ptr<jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_KnownFormats<jbcoin::LedgerEntryType>).m_formats.
  super__Vector_base<std::unique_ptr<jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item>_>,_std::allocator<std::unique_ptr<jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_KnownFormats<jbcoin::LedgerEntryType>).m_formats.
  super__Vector_base<std::unique_ptr<jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item>_>,_std::allocator<std::unique_ptr<jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item,_std::default_delete<jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->super_KnownFormats<jbcoin::LedgerEntryType>).m_names._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_KnownFormats<jbcoin::LedgerEntryType>).m_names._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  (this->super_KnownFormats<jbcoin::LedgerEntryType>).m_names._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_parent = (_Base_ptr)0x0;
  (this->super_KnownFormats<jbcoin::LedgerEntryType>).m_names._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_left = &p_Var1->_M_header;
  (this->super_KnownFormats<jbcoin::LedgerEntryType>).m_names._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_right = &p_Var1->_M_header;
  (this->super_KnownFormats<jbcoin::LedgerEntryType>).m_names._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  p_Var1 = &(this->super_KnownFormats<jbcoin::LedgerEntryType>).m_types._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_KnownFormats<jbcoin::LedgerEntryType>).m_types._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  (this->super_KnownFormats<jbcoin::LedgerEntryType>).m_types._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_parent = (_Base_ptr)0x0;
  (this->super_KnownFormats<jbcoin::LedgerEntryType>).m_types._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_left = &p_Var1->_M_header;
  (this->super_KnownFormats<jbcoin::LedgerEntryType>).m_types._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_right = &p_Var1->_M_header;
  (this->super_KnownFormats<jbcoin::LedgerEntryType>).m_types._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_KnownFormats<jbcoin::LedgerEntryType>)._vptr_KnownFormats =
       (_func_int **)&PTR_addCommonFields_002d6e38;
  pIVar2 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"AccountRoot",
                      ltACCOUNT_ROOT);
  local_110.e_field = (SField *)sfAccount;
  local_110.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_110);
  local_120.e_field = (SField *)sfSequence;
  local_120.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_120);
  local_100.e_field = (SField *)sfBalance;
  local_100.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_100);
  local_f0.e_field = (SField *)sfOwnerCount;
  local_f0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_f0);
  local_e0.e_field = (SField *)sfPreviousTxnID;
  local_e0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_e0);
  local_d0.e_field = (SField *)sfPreviousTxnLgrSeq;
  local_d0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_d0);
  local_90.e_field = (SField *)sfAccountTxnID;
  local_90.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_90);
  local_a0.e_field = (SField *)sfRegularKey;
  local_a0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  local_b0.e_field = (SField *)sfEmailHash;
  local_b0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_c0.e_field = (SField *)sfWalletLocator;
  local_c0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_80.e_field = (SField *)sfWalletSize;
  local_80.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_80);
  local_70.e_field = (SField *)sfMessageKey;
  local_70.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_70);
  local_60.e_field = (SField *)sfTransferRate;
  local_60.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_60);
  local_40.e_field = (SField *)sfDomain;
  local_40.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_40);
  local_50.e_field = (SField *)sfTickSize;
  local_50.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_50);
  pIVar2 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"DirectoryNode",ltDIR_NODE)
  ;
  local_110.e_field = (SField *)sfOwner;
  local_110.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_110);
  local_120.e_field = (SField *)sfTakerPaysCurrency;
  local_120.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_120);
  local_100.e_field = (SField *)sfTakerPaysIssuer;
  local_100.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_100);
  local_f0.e_field = (SField *)sfTakerGetsCurrency;
  local_f0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_f0);
  local_e0.e_field = (SField *)sfTakerGetsIssuer;
  local_e0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_e0);
  local_d0.e_field = (SField *)sfExchangeRate;
  local_d0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_d0);
  local_90.e_field = (SField *)sfIndexes;
  local_90.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_90);
  local_a0.e_field = (SField *)sfRootIndex;
  local_a0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  local_b0.e_field = (SField *)sfIndexNext;
  local_b0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_c0.e_field = (SField *)sfIndexPrevious;
  local_c0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  pIVar2 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"Offer",ltOFFER);
  local_110.e_field = (SField *)sfAccount;
  local_110.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_110);
  local_120.e_field = (SField *)sfSequence;
  local_120.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_120);
  local_100.e_field = (SField *)sfTakerPays;
  local_100.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_100);
  local_f0.e_field = (SField *)sfTakerGets;
  local_f0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_f0);
  local_e0.e_field = (SField *)sfBookDirectory;
  local_e0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_e0);
  local_d0.e_field = (SField *)sfBookNode;
  local_d0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_d0);
  local_90.e_field = (SField *)sfOwnerNode;
  local_90.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_90);
  local_a0.e_field = (SField *)sfPreviousTxnID;
  local_a0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  local_b0.e_field = (SField *)sfPreviousTxnLgrSeq;
  local_b0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_c0.e_field = (SField *)sfExpiration;
  local_c0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  pIVar2 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"JbcoinState",
                      ltJBCOIN_STATE);
  local_110.e_field = (SField *)sfBalance;
  local_110.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_110);
  local_120.e_field = (SField *)sfLowLimit;
  local_120.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_120);
  local_100.e_field = (SField *)sfHighLimit;
  local_100.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_100);
  local_f0.e_field = (SField *)sfPreviousTxnID;
  local_f0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_f0);
  local_e0.e_field = (SField *)sfPreviousTxnLgrSeq;
  local_e0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_e0);
  local_d0.e_field = (SField *)sfLowNode;
  local_d0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_d0);
  local_90.e_field = (SField *)sfLowQualityIn;
  local_90.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_90);
  local_a0.e_field = (SField *)sfLowQualityOut;
  local_a0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  local_b0.e_field = (SField *)sfHighNode;
  local_b0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_c0.e_field = (SField *)sfHighQualityIn;
  local_c0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_80.e_field = (SField *)sfHighQualityOut;
  local_80.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_80);
  pIVar2 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"Escrow",ltESCROW);
  local_110.e_field = (SField *)sfAccount;
  local_110.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_110);
  local_120.e_field = (SField *)sfDestination;
  local_120.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_120);
  local_100.e_field = (SField *)sfAmount;
  local_100.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_100);
  local_f0.e_field = (SField *)sfCondition;
  local_f0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_f0);
  local_e0.e_field = (SField *)sfCancelAfter;
  local_e0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_e0);
  local_d0.e_field = (SField *)sfFinishAfter;
  local_d0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_d0);
  local_90.e_field = (SField *)sfSourceTag;
  local_90.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_90);
  local_a0.e_field = (SField *)sfDestinationTag;
  local_a0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  local_b0.e_field = (SField *)sfOwnerNode;
  local_b0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_c0.e_field = (SField *)sfPreviousTxnID;
  local_c0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_80.e_field = (SField *)sfPreviousTxnLgrSeq;
  local_80.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_80);
  local_70.e_field = (SField *)sfDestinationNode;
  local_70.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_70);
  pIVar2 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"LedgerHashes",
                      ltLEDGER_HASHES);
  local_110.e_field = (SField *)sfFirstLedgerSequence;
  local_110.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_110);
  local_120.e_field = (SField *)sfLastLedgerSequence;
  local_120.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_120);
  local_100.e_field = (SField *)sfHashes;
  local_100.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_100);
  pIVar2 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"Amendments",ltAMENDMENTS);
  local_110.e_field = (SField *)sfAmendments;
  local_110.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_110);
  local_120.e_field = (SField *)sfMajorities;
  local_120.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_120);
  pIVar2 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"FeeSettings",
                      ltFEE_SETTINGS);
  local_110.e_field = (SField *)sfBaseFee;
  local_110.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_110);
  local_120.e_field = (SField *)sfReferenceFeeUnits;
  local_120.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_120);
  local_100.e_field = (SField *)sfReserveBase;
  local_100.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_100);
  local_f0.e_field = (SField *)sfReserveIncrement;
  local_f0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_f0);
  pIVar2 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"Ticket",ltTICKET);
  local_110.e_field = (SField *)sfAccount;
  local_110.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_110);
  local_120.e_field = (SField *)sfSequence;
  local_120.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_120);
  local_100.e_field = (SField *)sfOwnerNode;
  local_100.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_100);
  local_f0.e_field = (SField *)sfTarget;
  local_f0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_f0);
  local_e0.e_field = (SField *)sfExpiration;
  local_e0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_e0);
  pIVar2 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"SignerList",ltSIGNER_LIST)
  ;
  local_110.e_field = (SField *)sfOwnerNode;
  local_110.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_110);
  local_120.e_field = (SField *)sfSignerQuorum;
  local_120.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_120);
  local_100.e_field = (SField *)sfSignerEntries;
  local_100.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_100);
  local_f0.e_field = (SField *)sfSignerListID;
  local_f0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_f0);
  local_e0.e_field = (SField *)sfPreviousTxnID;
  local_e0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_e0);
  local_d0.e_field = (SField *)sfPreviousTxnLgrSeq;
  local_d0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_d0);
  pIVar2 = KnownFormats<jbcoin::LedgerEntryType>::add
                     (&this->super_KnownFormats<jbcoin::LedgerEntryType>,"PayChannel",ltPAYCHAN);
  local_110.e_field = (SField *)sfAccount;
  local_110.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_110);
  local_120.e_field = (SField *)sfDestination;
  local_120.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_120);
  local_100.e_field = (SField *)sfAmount;
  local_100.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_100);
  local_f0.e_field = (SField *)sfBalance;
  local_f0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_f0);
  local_e0.e_field = (SField *)sfPublicKey;
  local_e0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_e0);
  local_d0.e_field = (SField *)sfSettleDelay;
  local_d0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_d0);
  local_90.e_field = (SField *)sfExpiration;
  local_90.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_90);
  local_a0.e_field = (SField *)sfCancelAfter;
  local_a0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_a0);
  local_b0.e_field = (SField *)sfSourceTag;
  local_b0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_b0);
  local_c0.e_field = (SField *)sfDestinationTag;
  local_c0.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&pIVar2->elements,&local_c0);
  local_80.e_field = (SField *)sfOwnerNode;
  local_80.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_80);
  local_70.e_field = (SField *)sfPreviousTxnID;
  local_70.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_70);
  local_60.e_field = (SField *)sfPreviousTxnLgrSeq;
  local_60.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar2->elements,&local_60);
  return;
}

Assistant:

LedgerFormats::LedgerFormats ()
{
    add ("AccountRoot", ltACCOUNT_ROOT)
            << SOElement (sfAccount,             SOE_REQUIRED)
            << SOElement (sfSequence,            SOE_REQUIRED)
            << SOElement (sfBalance,             SOE_REQUIRED)
            << SOElement (sfOwnerCount,          SOE_REQUIRED)
            << SOElement (sfPreviousTxnID,       SOE_REQUIRED)
            << SOElement (sfPreviousTxnLgrSeq,   SOE_REQUIRED)
            << SOElement (sfAccountTxnID,        SOE_OPTIONAL)
            << SOElement (sfRegularKey,          SOE_OPTIONAL)
            << SOElement (sfEmailHash,           SOE_OPTIONAL)
            << SOElement (sfWalletLocator,       SOE_OPTIONAL)
            << SOElement (sfWalletSize,          SOE_OPTIONAL)
            << SOElement (sfMessageKey,          SOE_OPTIONAL)
            << SOElement (sfTransferRate,        SOE_OPTIONAL)
            << SOElement (sfDomain,              SOE_OPTIONAL)
            << SOElement (sfTickSize,            SOE_OPTIONAL)
            ;

    add ("DirectoryNode", ltDIR_NODE)
            << SOElement (sfOwner,               SOE_OPTIONAL)  // for owner directories
            << SOElement (sfTakerPaysCurrency,   SOE_OPTIONAL)  // for order book directories
            << SOElement (sfTakerPaysIssuer,     SOE_OPTIONAL)  // for order book directories
            << SOElement (sfTakerGetsCurrency,   SOE_OPTIONAL)  // for order book directories
            << SOElement (sfTakerGetsIssuer,     SOE_OPTIONAL)  // for order book directories
            << SOElement (sfExchangeRate,        SOE_OPTIONAL)  // for order book directories
            << SOElement (sfIndexes,             SOE_REQUIRED)
            << SOElement (sfRootIndex,           SOE_REQUIRED)
            << SOElement (sfIndexNext,           SOE_OPTIONAL)
            << SOElement (sfIndexPrevious,       SOE_OPTIONAL)
            ;

    add ("Offer", ltOFFER)
            << SOElement (sfAccount,             SOE_REQUIRED)
            << SOElement (sfSequence,            SOE_REQUIRED)
            << SOElement (sfTakerPays,           SOE_REQUIRED)
            << SOElement (sfTakerGets,           SOE_REQUIRED)
            << SOElement (sfBookDirectory,       SOE_REQUIRED)
            << SOElement (sfBookNode,            SOE_REQUIRED)
            << SOElement (sfOwnerNode,           SOE_REQUIRED)
            << SOElement (sfPreviousTxnID,       SOE_REQUIRED)
            << SOElement (sfPreviousTxnLgrSeq,   SOE_REQUIRED)
            << SOElement (sfExpiration,          SOE_OPTIONAL)
            ;

    add ("JbcoinState", ltJBCOIN_STATE)
            << SOElement (sfBalance,             SOE_REQUIRED)
            << SOElement (sfLowLimit,            SOE_REQUIRED)
            << SOElement (sfHighLimit,           SOE_REQUIRED)
            << SOElement (sfPreviousTxnID,       SOE_REQUIRED)
            << SOElement (sfPreviousTxnLgrSeq,   SOE_REQUIRED)
            << SOElement (sfLowNode,             SOE_OPTIONAL)
            << SOElement (sfLowQualityIn,        SOE_OPTIONAL)
            << SOElement (sfLowQualityOut,       SOE_OPTIONAL)
            << SOElement (sfHighNode,            SOE_OPTIONAL)
            << SOElement (sfHighQualityIn,       SOE_OPTIONAL)
            << SOElement (sfHighQualityOut,      SOE_OPTIONAL)
            ;

    add ("Escrow", ltESCROW) <<
        SOElement (sfAccount,           SOE_REQUIRED) <<
        SOElement (sfDestination,       SOE_REQUIRED) <<
        SOElement (sfAmount,            SOE_REQUIRED) <<
        SOElement (sfCondition,         SOE_OPTIONAL) <<
        SOElement (sfCancelAfter,       SOE_OPTIONAL) <<
        SOElement (sfFinishAfter,       SOE_OPTIONAL) <<
        SOElement (sfSourceTag,         SOE_OPTIONAL) <<
        SOElement (sfDestinationTag,    SOE_OPTIONAL) <<
        SOElement (sfOwnerNode,         SOE_REQUIRED) <<
        SOElement (sfPreviousTxnID,     SOE_REQUIRED) <<
        SOElement (sfPreviousTxnLgrSeq, SOE_REQUIRED) <<
        SOElement (sfDestinationNode,   SOE_OPTIONAL);

    add ("LedgerHashes", ltLEDGER_HASHES)
            << SOElement (sfFirstLedgerSequence, SOE_OPTIONAL) // Remove if we do a ledger restart
            << SOElement (sfLastLedgerSequence,  SOE_OPTIONAL)
            << SOElement (sfHashes,              SOE_REQUIRED)
            ;

    add ("Amendments", ltAMENDMENTS)
            << SOElement (sfAmendments,          SOE_OPTIONAL) // Enabled
            << SOElement (sfMajorities,          SOE_OPTIONAL)
            ;

    add ("FeeSettings", ltFEE_SETTINGS)
            << SOElement (sfBaseFee,             SOE_REQUIRED)
            << SOElement (sfReferenceFeeUnits,   SOE_REQUIRED)
            << SOElement (sfReserveBase,         SOE_REQUIRED)
            << SOElement (sfReserveIncrement,    SOE_REQUIRED)
            ;

    add ("Ticket", ltTICKET)
            << SOElement (sfAccount,             SOE_REQUIRED)
            << SOElement (sfSequence,            SOE_REQUIRED)
            << SOElement (sfOwnerNode,           SOE_REQUIRED)
            << SOElement (sfTarget,              SOE_OPTIONAL)
            << SOElement (sfExpiration,          SOE_OPTIONAL)
            ;

    // All fields are SOE_REQUIRED because there is always a
    // SignerEntries.  If there are no SignerEntries the node is deleted.
    add ("SignerList", ltSIGNER_LIST)
            << SOElement (sfOwnerNode,           SOE_REQUIRED)
            << SOElement (sfSignerQuorum,        SOE_REQUIRED)
            << SOElement (sfSignerEntries,       SOE_REQUIRED)
            << SOElement (sfSignerListID,        SOE_REQUIRED)
            << SOElement (sfPreviousTxnID,       SOE_REQUIRED)
            << SOElement (sfPreviousTxnLgrSeq,   SOE_REQUIRED)
            ;

    add ("PayChannel", ltPAYCHAN)
            << SOElement (sfAccount,           SOE_REQUIRED)
            << SOElement (sfDestination,       SOE_REQUIRED)
            << SOElement (sfAmount,            SOE_REQUIRED)
            << SOElement (sfBalance,           SOE_REQUIRED)
            << SOElement (sfPublicKey,         SOE_REQUIRED)
            << SOElement (sfSettleDelay,       SOE_REQUIRED)
            << SOElement (sfExpiration,        SOE_OPTIONAL)
            << SOElement (sfCancelAfter,       SOE_OPTIONAL)
            << SOElement (sfSourceTag,         SOE_OPTIONAL)
            << SOElement (sfDestinationTag,    SOE_OPTIONAL)
            << SOElement (sfOwnerNode,         SOE_REQUIRED)
            << SOElement (sfPreviousTxnID,     SOE_REQUIRED)
            << SOElement (sfPreviousTxnLgrSeq, SOE_REQUIRED)
            ;
}